

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

int __thiscall libtorrent::aux::udp_socket::close(udp_socket *this,int __fd)

{
  bool bVar1;
  element_type *this_00;
  int __fd_00;
  undefined1 local_20 [8];
  error_code ec;
  udp_socket *this_local;
  
  ec.cat_ = (error_category *)this;
  boost::system::error_code::error_code((error_code *)local_20);
  __fd_00 = (int)local_20;
  boost::asio::
  basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::close((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           *)this,__fd_00);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_socks5_connection);
  if (bVar1) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_socks5_connection);
    socks5::close(this_00,__fd_00);
    ::std::__shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_socks5_connection).
                super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>);
  }
  this->field_0xf0 = this->field_0xf0 & 0xfe | 1;
  return (int)this;
}

Assistant:

void udp_socket::close()
{
	TORRENT_ASSERT(is_single_thread());

	error_code ec;
	m_socket.close(ec);
	TORRENT_ASSERT_VAL(!ec || ec == error::bad_descriptor, ec);
	if (m_socks5_connection)
	{
		m_socks5_connection->close();
		m_socks5_connection.reset();
	}
	m_abort = true;
}